

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

PtrTokenOrSyntax * __thiscall
slang::syntax::DefaultClockingReferenceSyntax::getChildPtr
          (PtrTokenOrSyntax *__return_storage_ptr__,DefaultClockingReferenceSyntax *this,
          size_t index)

{
  PtrTokenOrSyntax *pPVar1;
  
  switch(this) {
  case (DefaultClockingReferenceSyntax *)0x0:
    return __return_storage_ptr__ + 2;
  case (DefaultClockingReferenceSyntax *)0x1:
    pPVar1 = __return_storage_ptr__ + 5;
    break;
  case (DefaultClockingReferenceSyntax *)0x2:
    pPVar1 = __return_storage_ptr__ + 6;
    break;
  case (DefaultClockingReferenceSyntax *)0x3:
    pPVar1 = __return_storage_ptr__ + 7;
    break;
  case (DefaultClockingReferenceSyntax *)0x4:
    pPVar1 = __return_storage_ptr__ + 8;
    break;
  default:
    return (PtrTokenOrSyntax *)0x0;
  }
  return pPVar1;
}

Assistant:

PtrTokenOrSyntax DefaultClockingReferenceSyntax::getChildPtr(size_t index) {
    switch (index) {
        case 0: return &attributes;
        case 1: return &defaultKeyword;
        case 2: return &clocking;
        case 3: return &name;
        case 4: return &semi;
        default: return nullptr;
    }
}